

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<const_phmap::parallel_flat_hash_map<int,_int,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>_&>
::MatchAndExplain(UnorderedElementsAreMatcherImpl<const_phmap::parallel_flat_hash_map<int,_int,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>_&>
                  *this,parallel_flat_hash_map<int,_int,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>
                        *container,MatchResultListener *listener)

{
  const_iterator elem_first;
  const_iterator elem_last;
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  element_printouts;
  MatchMatrix matrix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  MatchMatrix local_a0;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  anon_union_8_1_a8a14541_for_iterator_1 aStack_50;
  iterator local_40;
  
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::begin(&local_40,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *)container);
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  local_58 = 0;
  elem_first.iter_.inner_end_ = local_40.inner_end_;
  elem_first.iter_.inner_ = local_40.inner_;
  elem_first.iter_.it_.ctrl_ = local_40.it_.ctrl_;
  elem_first.iter_.it_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)
       (anon_union_8_1_a8a14541_for_iterator_1)local_40.it_.field_1.slot_;
  elem_first.iter_.it_end_.ctrl_ = local_40.it_end_.ctrl_;
  elem_first.iter_.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)
       (anon_union_8_1_a8a14541_for_iterator_1)local_40.it_end_.field_1.slot_;
  elem_last.iter_.it_.ctrl_ = (ctrl_t *)0x0;
  elem_last.iter_.inner_ = (Inner *)0x0;
  elem_last.iter_.inner_end_ = (Inner *)0x0;
  elem_last.iter_.it_.field_1 = (anon_union_8_1_a8a14541_for_iterator_1)uStack_60;
  elem_last.iter_.it_end_.ctrl_ = (ctrl_t *)0x0;
  elem_last.iter_.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)
       (anon_union_8_1_a8a14541_for_iterator_1)aStack_50.slot_;
  UnorderedElementsAreMatcherImpl<phmap::parallel_flat_hash_map<int,int,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>,4ul,phmap::NullMutex>const&>
  ::
  AnalyzeElements<phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>>::const_iterator>
            (&local_a0,
             (UnorderedElementsAreMatcherImpl<phmap::parallel_flat_hash_map<int,int,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>,4ul,phmap::NullMutex>const&>
              *)this,elem_first,elem_last,&local_b8,listener);
  bVar1 = UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix
                    (&this->super_UnorderedElementsAreMatcherImplBase,&local_b8,&local_a0,listener);
  if (bVar1) {
    bVar1 = UnorderedElementsAreMatcherImplBase::FindPairing
                      (&this->super_UnorderedElementsAreMatcherImplBase,&local_a0,listener);
  }
  else {
    bVar1 = false;
  }
  if (local_a0.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  return bVar1;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    StlContainerReference stl_container = View::ConstReference(container);
    ::std::vector<std::string> element_printouts;
    MatchMatrix matrix =
        AnalyzeElements(stl_container.begin(), stl_container.end(),
                        &element_printouts, listener);

    return VerifyMatchMatrix(element_printouts, matrix, listener) &&
           FindPairing(matrix, listener);
  }